

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void process_ircs(void)

{
  ulong uVar1;
  long lVar2;
  BoolView local_48;
  BoolView local_38;
  
  if (ircs.sz != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_38.s = (&((ircs.data)->r).s)[lVar2];
      local_38.v = *(int *)((long)&((ircs.data)->r).v + lVar2);
      int_rel_reif_real(*(IntVar **)((long)&(ircs.data)->x + lVar2),
                        *(IntRelType *)((long)&(ircs.data)->t + lVar2),
                        *(int *)((long)&(ircs.data)->c + lVar2),&local_38);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar1 < (ircs._0_8_ & 0xffffffff));
  }
  if (ircs.data != (IRR *)0x0) {
    ircs.sz = 0;
    ircs.cap = 0;
    free(ircs.data);
    ircs.data = (IRR *)0x0;
  }
  if (ihrcs.sz != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_48.s = (&((ihrcs.data)->r).s)[lVar2];
      local_48.v = *(int *)((long)&((ihrcs.data)->r).v + lVar2);
      int_rel_half_reif_real
                (*(IntVar **)((long)&(ihrcs.data)->x + lVar2),
                 *(IntRelType *)((long)&(ihrcs.data)->t + lVar2),
                 *(int *)((long)&(ihrcs.data)->c + lVar2),&local_48);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar1 < (ihrcs._0_8_ & 0xffffffff));
  }
  if (ihrcs.data != (IRR *)0x0) {
    ihrcs.sz = 0;
    ihrcs.cap = 0;
    free(ihrcs.data);
    ihrcs.data = (IRR *)0x0;
  }
  return;
}

Assistant:

void process_ircs() {
	for (unsigned int i = 0; i < ircs.size(); i++) {
		int_rel_reif_real(ircs[i].x, ircs[i].t, ircs[i].c, ircs[i].r);
	}
	ircs.clear(true);
	for (unsigned int j = 0; j < ihrcs.size(); ++j) {
		int_rel_half_reif_real(ihrcs[j].x, ihrcs[j].t, ihrcs[j].c, ihrcs[j].r);
	}
	ihrcs.clear(true);
}